

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkRemapLevels(Wlc_Ntk_t *p,Vec_Int_t *vObjs,int nLevels)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar3;
  Vec_Int_t *vUsed;
  Vec_Int_t *vMap;
  int Res;
  int Level;
  int Entry;
  int iObj;
  int iFanin;
  int k;
  int i;
  int nLevels_local;
  Vec_Int_t *vObjs_local;
  Wlc_Ntk_t *p_local;
  
  vMap._4_4_ = 0;
  p_00 = Vec_IntStart(nLevels + 1);
  p_01 = Vec_IntStart(nLevels + 1);
  Vec_IntWriteEntry(p_01,nLevels,1);
  for (iFanin = 0; iVar1 = Vec_IntSize(vObjs), iFanin < iVar1; iFanin = iFanin + 1) {
    iVar1 = Vec_IntEntry(vObjs,iFanin);
    iVar2 = Wlc_ObjLevelId(p,iVar1);
    Vec_IntWriteEntry(p_01,iVar2,1);
    iObj = 0;
    while( true ) {
      pWVar3 = Wlc_NtkObj(p,iVar1);
      iVar2 = Wlc_ObjFaninNum(pWVar3);
      if (iVar2 <= iObj) break;
      pWVar3 = Wlc_NtkObj(p,iVar1);
      iVar2 = Wlc_ObjFaninId(pWVar3,iObj);
      if (iVar2 != 0) {
        iVar2 = Wlc_ObjLevelId(p,iVar2);
        Vec_IntWriteEntry(p_01,iVar2,1);
      }
      iObj = iObj + 1;
    }
  }
  for (iFanin = 0; iVar1 = Vec_IntSize(p_01), iFanin < iVar1; iFanin = iFanin + 1) {
    iVar1 = Vec_IntEntry(p_01,iFanin);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p_00,iFanin,vMap._4_4_);
      vMap._4_4_ = vMap._4_4_ + 1;
    }
  }
  for (iFanin = 0; iVar1 = Vec_IntSize(&p->vLevels), iFanin < iVar1; iFanin = iFanin + 1) {
    iVar1 = Vec_IntEntry(&p->vLevels,iFanin);
    iVar2 = Vec_IntEntry(p_01,iVar1);
    if (iVar2 == 0) {
      Vec_IntWriteEntry(&p->vLevels,iFanin,-1);
    }
    else {
      iVar1 = Vec_IntEntry(p_00,iVar1);
      Vec_IntWriteEntry(&p->vLevels,iFanin,iVar1);
    }
  }
  iVar1 = Vec_IntEntry(p_00,nLevels);
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  return iVar1;
}

Assistant:

int Wlc_NtkRemapLevels( Wlc_Ntk_t * p, Vec_Int_t * vObjs, int nLevels )
{
    int i, k, iFanin, iObj, Entry, Level = 0, Res = nLevels;
    Vec_Int_t * vMap  = Vec_IntStart( nLevels+1 );
    Vec_Int_t * vUsed = Vec_IntStart( nLevels+1 );
    // mark used levels
    Vec_IntWriteEntry( vUsed, nLevels, 1 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iObj), 1 );
        Wlc_ObjForEachFanin( Wlc_NtkObj(p, iObj), iFanin, k ) if ( iFanin )
            Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iFanin), 1 );
    }
    // create level map
    Vec_IntForEachEntry( vUsed, Entry, i )
        if ( Entry )
            Vec_IntWriteEntry( vMap, i, Level++ );
    //printf( "Total used levels %d -> %d\n", nLevels, Level );
    // remap levels
    Vec_IntForEachEntry( &p->vLevels, Level, i )
    {
        if ( Vec_IntEntry(vUsed, Level) )
            Vec_IntWriteEntry( &p->vLevels, i, Vec_IntEntry(vMap, Level) );
        else
            Vec_IntWriteEntry( &p->vLevels, i, -1 );
    }
    Res = Vec_IntEntry( vMap, nLevels );
    Vec_IntFree( vUsed );
    Vec_IntFree( vMap );
    return Res;
}